

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.cc
# Opt level: O1

float webrtc::GetMinimumSpacing
                (vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                 *array_geometry)

{
  undefined8 uVar1;
  string *result;
  pointer pCVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  uint local_1b4;
  ulong local_1b0;
  FatalMessage local_1a8;
  
  local_1a8._0_8_ =
       ((long)(array_geometry->
              super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(array_geometry->
              super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  local_1b4 = 1;
  if ((ulong)local_1a8._0_8_ < 2) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_int>
                       ((unsigned_long *)&local_1a8,&local_1b4,"array_geometry.size() > 1u");
  }
  else {
    result = (string *)0x0;
  }
  if (result != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/array_util.cc"
               ,0x1a,result);
    rtc::FatalMessage::~FatalMessage(&local_1a8);
  }
  if ((long)(array_geometry->
            super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(array_geometry->
            super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
            )._M_impl.super__Vector_impl_data._M_start == 0xc) {
    fVar7 = 3.4028235e+38;
  }
  else {
    fVar7 = 3.4028235e+38;
    lVar6 = 0x14;
    uVar3 = 0;
    do {
      uVar5 = uVar3 + 1;
      pCVar2 = (array_geometry->
               super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar6;
      fVar10 = fVar7;
      local_1b0 = uVar5;
      if (uVar5 < (ulong)(((long)(array_geometry->
                                 super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2 >> 2) *
                         -0x5555555555555555)) {
        do {
          uVar1 = *(undefined8 *)((long)pCVar2->c + lVar4 + -8);
          fVar8 = (float)*(undefined8 *)pCVar2[uVar3].c - (float)uVar1;
          fVar9 = (float)((ulong)*(undefined8 *)pCVar2[uVar3].c >> 0x20) -
                  (float)((ulong)uVar1 >> 0x20);
          fVar7 = pCVar2[uVar3].c[2] - *(float *)((long)pCVar2->c + lVar4);
          fVar7 = fVar7 * fVar7 + fVar8 * fVar8 + fVar9 * fVar9;
          if (fVar7 < 0.0) {
            fVar7 = sqrtf(fVar7);
          }
          else {
            fVar7 = SQRT(fVar7);
          }
          if (fVar10 <= fVar7) {
            fVar7 = fVar10;
          }
          uVar5 = uVar5 + 1;
          pCVar2 = (array_geometry->
                   super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar4 = lVar4 + 0xc;
          fVar10 = fVar7;
        } while (uVar5 < (ulong)(((long)(array_geometry->
                                        super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2
                                 >> 2) * -0x5555555555555555));
      }
      lVar6 = lVar6 + 0xc;
      uVar3 = local_1b0;
    } while (local_1b0 <
             ((long)(array_geometry->
                    super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(array_geometry->
                    super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 - 1U);
  }
  return fVar7;
}

Assistant:

float GetMinimumSpacing(const std::vector<Point>& array_geometry) {
  RTC_CHECK_GT(array_geometry.size(), 1u);
  float mic_spacing = std::numeric_limits<float>::max();
  for (size_t i = 0; i < (array_geometry.size() - 1); ++i) {
    for (size_t j = i + 1; j < array_geometry.size(); ++j) {
      mic_spacing =
          std::min(mic_spacing, Distance(array_geometry[i], array_geometry[j]));
    }
  }
  return mic_spacing;
}